

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erase_benchmark.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider _Var3;
  pointer *__dest;
  pointer __dest_00;
  long *plVar4;
  ostream *poVar5;
  istream *piVar6;
  int *piVar7;
  undefined8 uVar8;
  long *plVar9;
  ulong *puVar10;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  AVLTree<int> avlTree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  size_type __dnew;
  size_type __dnew_1;
  ofstream output_file1;
  ulong *local_740;
  long local_738;
  ulong local_730;
  long lStack_728;
  int local_71c;
  pointer local_718;
  ulong *local_710;
  long local_708;
  ulong local_700;
  long lStack_6f8;
  int local_6ec;
  ios_base *local_6e8;
  pointer *local_6e0;
  pointer local_6d8;
  pointer local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  undefined8 local_6a0;
  long *local_698;
  AVLTree<int> local_690;
  long *local_680;
  long local_678;
  long local_670;
  long lStack_668;
  pointer local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  long *local_520 [2];
  long local_510 [27];
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  ios_base local_3b8 [120];
  ios_base local_340 [272];
  long *local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_6e0 = local_6d0;
  local_640._M_dataplus._M_p = (pointer)0x8a;
  __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_640);
  _Var3._M_p = local_640._M_dataplus._M_p;
  local_6d0[0] = local_640._M_dataplus._M_p;
  local_6e0 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/erase"
         ,0x8a);
  local_6d8 = _Var3._M_p;
  *((long)__dest + _Var3._M_p) = '\0';
  paVar1 = &local_640.field_2;
  local_438 = (long *)0x77;
  local_640._M_dataplus._M_p = (pointer)paVar1;
  __dest_00 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_640,(ulong)&local_438);
  plVar4 = local_438;
  local_640.field_2._M_allocated_capacity = (size_type)local_438;
  local_640._M_dataplus._M_p = __dest_00;
  memcpy(__dest_00,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004"
         ,0x77);
  local_640._M_string_length = (size_type)plVar4;
  __dest_00[(long)plVar4] = '\0';
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_640);
  local_680 = &local_670;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_670 = *plVar9;
    lStack_668 = plVar4[3];
  }
  else {
    local_670 = *plVar9;
    local_680 = (long *)*plVar4;
  }
  local_678 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != paVar1) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_230,(string *)&local_680,_S_out);
  std::ofstream::close();
  local_640._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"100","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"500","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"1000","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"5000","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"10000","");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"50000","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"100000","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"500000","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"1000000","");
  plVar4 = local_510;
  local_520[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"5000000","");
  __l._M_len = 10;
  __l._M_array = &local_640;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_658,__l,(allocator_type *)&local_438);
  lVar11 = -0x140;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  itis::AVLTree<int>::AVLTree(&local_690);
  local_698 = _VTT;
  local_6a0 = __filebuf;
  local_718 = local_658.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_660 = local_658.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_6e8 = local_3b8;
    do {
      local_71c = 1;
      do {
        local_710 = &local_700;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_710,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)&local_710);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_710,(ulong)(local_718->_M_dataplus)._M_p);
        local_740 = &local_730;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_730 = *puVar10;
          lStack_728 = plVar4[3];
        }
        else {
          local_730 = *puVar10;
          local_740 = (ulong *)*plVar4;
        }
        local_738 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_740);
        local_438 = &local_428;
        plVar9 = plVar4 + 2;
        if ((long *)*plVar4 == plVar9) {
          local_428 = *plVar9;
          lStack_420 = plVar4[3];
        }
        else {
          local_428 = *plVar9;
          local_438 = (long *)*plVar4;
        }
        local_430 = plVar4[1];
        *plVar4 = (long)plVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ifstream::ifstream(&local_640,(string *)&local_438,_S_in);
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if (local_740 != &local_730) {
          operator_delete(local_740,local_730 + 1);
        }
        if (local_710 != &local_700) {
          operator_delete(local_710,local_700 + 1);
        }
        local_740 = &local_730;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_740,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)&local_740);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_740,(ulong)(local_718->_M_dataplus)._M_p);
        local_438 = &local_428;
        plVar9 = plVar4 + 2;
        if ((long *)*plVar4 == plVar9) {
          local_428 = *plVar9;
          lStack_420 = plVar4[3];
        }
        else {
          local_428 = *plVar9;
          local_438 = (long *)*plVar4;
        }
        local_430 = plVar4[1];
        *plVar4 = (long)plVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_438,local_430);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if (local_740 != &local_730) {
          operator_delete(local_740,local_730 + 1);
        }
        if ((*(byte *)((long)local_620 + *(long *)(local_640._M_dataplus._M_p + -0x18)) & 5) == 0) {
          local_740 = &local_730;
          local_738 = 0;
          local_730 = local_730 & 0xffffffffffffff00;
          while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&local_640,(string *)&local_740,','),
                ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)&local_438,(string *)&local_740,_S_out|_S_in);
            puVar10 = local_740;
            piVar7 = __errno_location();
            iVar2 = *piVar7;
            *piVar7 = 0;
            lVar11 = strtol((char *)puVar10,(char **)&local_710,10);
            if (local_710 == puVar10) {
              std::__throw_invalid_argument("stoi");
LAB_001031a4:
              std::__throw_out_of_range("stoi");
              goto LAB_001031b0;
            }
            if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_001031a4;
            if (*piVar7 == 0) {
              *piVar7 = iVar2;
            }
            itis::AVLTree<int>::insert(&local_690,(int)lVar11);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_438);
            std::ios_base::~ios_base(local_6e8);
          }
          if (local_740 != &local_730) {
            operator_delete(local_740,local_730 + 1);
          }
        }
        std::ifstream::close();
        local_6c0[0] = local_6b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6c0,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)local_6c0);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_6c0,(ulong)(local_718->_M_dataplus)._M_p);
        local_710 = &local_700;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_700 = *puVar10;
          lStack_6f8 = plVar4[3];
        }
        else {
          local_700 = *puVar10;
          local_710 = (ulong *)*plVar4;
        }
        local_708 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_710);
        local_740 = &local_730;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_730 = *puVar10;
          lStack_728 = plVar4[3];
        }
        else {
          local_730 = *puVar10;
          local_740 = (ulong *)*plVar4;
        }
        local_738 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ifstream::ifstream((stringstream *)&local_438,(string *)&local_740,_S_in);
        std::ifstream::operator=(&local_640,(ifstream *)&local_438);
        std::ifstream::~ifstream((stringstream *)&local_438);
        if (local_740 != &local_730) {
          operator_delete(local_740,local_730 + 1);
        }
        if (local_710 != &local_700) {
          operator_delete(local_710,local_700 + 1);
        }
        if (local_6c0[0] != local_6b0) {
          operator_delete(local_6c0[0],local_6b0[0] + 1);
        }
        if ((*(byte *)((long)local_620 + *(long *)(local_640._M_dataplus._M_p + -0x18)) & 5) == 0) {
          local_740 = &local_730;
          local_738 = 0;
          local_730 = local_730 & 0xffffffffffffff00;
          while( true ) {
            piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_640,(string *)&local_740,',');
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)&local_438,(string *)&local_740,_S_out|_S_in);
            std::chrono::_V2::system_clock::now();
            puVar10 = local_740;
            piVar7 = __errno_location();
            local_6ec = *piVar7;
            *piVar7 = 0;
            lVar11 = strtol((char *)puVar10,(char **)&local_710,10);
            if (local_710 == puVar10) {
LAB_001031b0:
              std::__throw_invalid_argument("stoi");
LAB_001031bc:
              uVar8 = std::__throw_out_of_range("stoi");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_658);
              local_230 = _VTT;
              *(undefined8 *)(local_228 + _VTT[-3] + -8) = __filebuf;
              std::filebuf::~filebuf(local_228);
              std::ios_base::~ios_base(local_138);
              if (local_680 != &local_670) {
                operator_delete(local_680,local_670 + 1);
              }
              if (local_6e0 != local_6d0) {
                operator_delete(local_6e0,(ulong)(local_6d0[0] + 1));
              }
              _Unwind_Resume(uVar8);
            }
            if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_001031bc;
            if (*piVar7 == 0) {
              *piVar7 = local_6ec;
            }
            itis::AVLTree<int>::erase(&local_690,(int)lVar11);
            std::chrono::_V2::system_clock::now();
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_438);
            std::ios_base::~ios_base(local_6e8);
          }
          if (local_740 != &local_730) {
            operator_delete(local_740,local_730 + 1);
          }
        }
        poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        itis::AVLTree<int>::clear(&local_690);
        std::ifstream::close();
        std::ofstream::ofstream((stringstream *)&local_438,(string *)&local_680,_S_app);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_438,(local_718->_M_dataplus)._M_p,
                            local_718->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_71c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::ofstream::close();
        local_438 = local_698;
        *(undefined8 *)((long)&local_438 + local_698[-3]) = local_6a0;
        std::filebuf::~filebuf((filebuf *)&local_430);
        std::ios_base::~ios_base(local_340);
        std::ifstream::~ifstream(&local_640);
        local_71c = local_71c + 1;
      } while (local_71c != 0xb);
      local_718 = local_718 + 1;
      local_71c = 0xb;
    } while (local_718 != local_660);
  }
  itis::AVLTree<int>::~AVLTree(&local_690);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658);
  local_230 = local_698;
  *(undefined8 *)(local_228 + local_698[-3] + -8) = local_6a0;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_680 != &local_670) {
    operator_delete(local_680,local_670 + 1);
  }
  if (local_6e0 != local_6d0) {
    operator_delete(local_6e0,(ulong)(local_6d0[0] + 1));
  }
  return 0;
}

Assistant:

int main() {

  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/eraseResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;
  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_erase = chrono::nanoseconds::zero();
      cout << (path + "/" + file) << endl;

      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);  // оборачиваем строку в объект "поток"
          avlTree.insert(stoi(line));
          line_number++;
        }
      }
      input_file.close();
      input_file = ifstream(path + "/" + file + ".csv");

      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_erase = chrono::high_resolution_clock::now();
          avlTree.erase(stoi(line));
          const auto time_point_after_erase = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_erase += time_point_after_erase - time_point_before_erase;
        }
      }

      const auto time_elapsed_ns_erase = chrono::duration_cast<chrono::nanoseconds>(time_diff_erase).count();
      cout << time_elapsed_ns_erase << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = ofstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_erase << endl;
      output_file.close();
    }
  }
  return 0;
}